

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext *ctx,ExprAssignment *node)

{
  TypeBase *targetType;
  ExpressionContext *pEVar1;
  LLVMValueRef pLVar2;
  long lVar3;
  TypeBase *valueType;
  
  CompileLlvm(ctx,node->lhs);
  pLVar2 = CompileLlvm(ctx,node->rhs);
  targetType = node->rhs->type;
  pEVar1 = ctx->ctx;
  lVar3 = 0x89d8;
  if (((pEVar1->typeBool != targetType) && (pEVar1->typeChar != targetType)) &&
     (pEVar1->typeShort != targetType)) {
    valueType = targetType;
    if (pEVar1->typeFloat != targetType) goto LAB_0019320c;
    lVar3 = 0x89f0;
  }
  valueType = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar3 + -0x30);
LAB_0019320c:
  ConvertToDataType(ctx,pLVar2,valueType,targetType);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmAssignment(LlvmCompilationContext &ctx, ExprAssignment *node)
{
	LLVMValueRef address = CompileLlvm(ctx, node->lhs);

	LLVMValueRef initializer = CompileLlvm(ctx, node->rhs);

	LLVMBuildStore(ctx.builder, ConvertToDataType(ctx, initializer, GetStackType(ctx, node->rhs->type), node->rhs->type), address);

	return CheckType(ctx, node, initializer);
}